

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSym.c
# Opt level: O0

int Sim_ComputeTwoVarSymms(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Sym_Man_t *p_00;
  abctime aVar3;
  abctime aVar4;
  abctime clkTotal;
  abctime clk;
  int i;
  int Result;
  Vec_Ptr_t *vResult;
  Sym_Man_t *p;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar2 = Abc_Clock();
  srand(0xabc);
  p_00 = Sym_ManStart(pNtk,fVerbose);
  iVar1 = Sim_UtilCountAllPairs(p_00->vSuppFun,p_00->nSimWords,p_00->vPairsTotal);
  p_00->nPairsRem = iVar1;
  p_00->nPairsTotal = iVar1;
  if (fVerbose != 0) {
    printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",
           (ulong)(uint)p_00->nPairsTotal,(ulong)(uint)p_00->nPairsSymm,
           (ulong)(uint)p_00->nPairsNonSymm,(ulong)(uint)p_00->nPairsRem);
  }
  aVar3 = Abc_Clock();
  Sim_SymmsStructCompute(pNtk,p_00->vMatrSymms,p_00->vSuppFun);
  aVar4 = Abc_Clock();
  p_00->timeStruct = aVar4 - aVar3;
  Sim_UtilCountPairsAll(p_00);
  p_00->nPairsSymmStr = p_00->nPairsSymm;
  if (fVerbose != 0) {
    printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",
           (ulong)(uint)p_00->nPairsTotal,(ulong)(uint)p_00->nPairsSymm,
           (ulong)(uint)p_00->nPairsNonSymm,(ulong)(uint)p_00->nPairsRem);
  }
  clk._0_4_ = 1;
  do {
    if (1000 < (int)clk) {
      clk._0_4_ = 1;
      do {
        iVar1 = Sim_SymmsGetPatternUsingSat(p_00,p_00->uPatRand);
        if (iVar1 == 0) {
          Sim_UtilCountPairsAll(p_00);
          if (fVerbose != 0) {
            printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",
                   (ulong)(uint)p_00->nPairsTotal,(ulong)(uint)p_00->nPairsSymm,
                   (ulong)(uint)p_00->nPairsNonSymm,(ulong)(uint)p_00->nPairsRem);
          }
          iVar1 = p_00->nPairsSymm;
          aVar3 = Abc_Clock();
          p_00->timeTotal = aVar3 - aVar2;
          Sym_ManStop(p_00);
          return iVar1;
        }
        Sim_SymmsSimulate(p_00,p_00->uPatRand,p_00->vMatrNonSymms);
        iVar1 = p_00->iVar1 >> 5;
        p_00->uPatRand[iVar1] = 1 << ((byte)p_00->iVar1 & 0x1f) ^ p_00->uPatRand[iVar1];
        Sim_SymmsSimulate(p_00,p_00->uPatRand,p_00->vMatrNonSymms);
        iVar1 = p_00->iVar2 >> 5;
        p_00->uPatRand[iVar1] = 1 << ((byte)p_00->iVar2 & 0x1f) ^ p_00->uPatRand[iVar1];
        Sim_SymmsSimulate(p_00,p_00->uPatRand,p_00->vMatrNonSymms);
        iVar1 = p_00->iVar1 >> 5;
        p_00->uPatRand[iVar1] = 1 << ((byte)p_00->iVar1 & 0x1f) ^ p_00->uPatRand[iVar1];
        Sim_SymmsSimulate(p_00,p_00->uPatRand,p_00->vMatrNonSymms);
        iVar1 = p_00->iVar2 >> 5;
        p_00->uPatRand[iVar1] = 1 << ((byte)p_00->iVar2 & 0x1f) ^ p_00->uPatRand[iVar1];
        if ((int)clk % 10 == 0) {
          iVar1 = Sim_UtilMatrsAreDisjoint(p_00);
          if (iVar1 == 0) {
            __assert_fail("Sim_UtilMatrsAreDisjoint( p )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSym.c"
                          ,0x75,"int Sim_ComputeTwoVarSymms(Abc_Ntk_t *, int)");
          }
          Sim_UtilCountPairsAll(p_00);
          if (((int)clk % 0x32 == 0) && (fVerbose != 0)) {
            printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",
                   (ulong)(uint)p_00->nPairsTotal,(ulong)(uint)p_00->nPairsSymm,
                   (ulong)(uint)p_00->nPairsNonSymm,(ulong)(uint)p_00->nPairsRem);
          }
        }
        clk._0_4_ = (int)clk + 1;
      } while( true );
    }
    Sim_UtilSetRandom(p_00->uPatRand,p_00->nSimWords);
    Sim_SymmsSimulate(p_00,p_00->uPatRand,p_00->vMatrNonSymms);
    if ((int)clk % 0x32 == 0) {
      iVar1 = Sim_UtilMatrsAreDisjoint(p_00);
      if (iVar1 == 0) {
        __assert_fail("Sim_UtilMatrsAreDisjoint( p )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSym.c"
                      ,0x53,"int Sim_ComputeTwoVarSymms(Abc_Ntk_t *, int)");
      }
      Sim_UtilCountPairsAll(p_00);
      if (((int)clk % 500 == 0) && (fVerbose != 0)) {
        printf("Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n",
               (ulong)(uint)p_00->nPairsTotal,(ulong)(uint)p_00->nPairsSymm,
               (ulong)(uint)p_00->nPairsNonSymm,(ulong)(uint)p_00->nPairsRem);
      }
    }
    clk._0_4_ = (int)clk + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes two variable symmetries.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Sim_ComputeTwoVarSymms( Abc_Ntk_t * pNtk, int fVerbose )
{
    Sym_Man_t * p;
    Vec_Ptr_t * vResult;
    int Result;
    int i;
    abctime clk, clkTotal = Abc_Clock();

    srand( 0xABC );

    // start the simulation manager
    p = Sym_ManStart( pNtk, fVerbose );
    p->nPairsTotal = p->nPairsRem = Sim_UtilCountAllPairs( p->vSuppFun, p->nSimWords, p->vPairsTotal );
    if ( fVerbose )
        printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
               p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );

    // detect symmetries using circuit structure
clk = Abc_Clock();
    Sim_SymmsStructCompute( pNtk, p->vMatrSymms, p->vSuppFun );
p->timeStruct = Abc_Clock() - clk;

    Sim_UtilCountPairsAll( p );
    p->nPairsSymmStr = p->nPairsSymm;
    if ( fVerbose )
        printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
            p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );

    // detect symmetries using simulation
    for ( i = 1; i <= 1000; i++ )
    {
        // simulate this pattern
        Sim_UtilSetRandom( p->uPatRand, p->nSimWords );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        if ( i % 50 != 0 )
            continue;
        // check disjointness
        assert( Sim_UtilMatrsAreDisjoint( p ) );
        // count the number of pairs
        Sim_UtilCountPairsAll( p );
        if ( i % 500 != 0 )
            continue;
        if ( fVerbose )
            printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
                p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );
    }

    // detect symmetries using SAT
    for ( i = 1; Sim_SymmsGetPatternUsingSat( p, p->uPatRand ); i++ )
    {
        // simulate this pattern in four polarities
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar1 );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar2 );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar1 );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar2 );
/*
        // try the previuos pair
        Sim_XorBit( p->uPatRand, p->iVar1Old );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar2Old );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
        Sim_XorBit( p->uPatRand, p->iVar1Old );
        Sim_SymmsSimulate( p, p->uPatRand, p->vMatrNonSymms );
*/
        if ( i % 10 != 0 )
            continue;
        // check disjointness
        assert( Sim_UtilMatrsAreDisjoint( p ) );
        // count the number of pairs
        Sim_UtilCountPairsAll( p );
        if ( i % 50 != 0 )
            continue;
        if ( fVerbose )
            printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
                p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );
    }

    // count the number of pairs
    Sim_UtilCountPairsAll( p );
    if ( fVerbose )
        printf( "Total = %8d.  Sym = %8d.  NonSym = %8d.  Remaining = %8d.\n", 
            p->nPairsTotal, p->nPairsSymm, p->nPairsNonSymm, p->nPairsRem );
//    Sim_UtilCountPairsAllPrint( p );

    Result = p->nPairsSymm;
    vResult = p->vMatrSymms;  
p->timeTotal = Abc_Clock() - clkTotal;
    //  p->vMatrSymms = NULL;
    Sym_ManStop( p );
    return Result;
}